

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall Js::ByteCodeWriter::Data::Copy(Data *this,Recycler *alloc,ByteBlock **finalBlock)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  ByteBlock *this_00;
  byte *pbVar5;
  byte *local_48;
  byte *currentDest;
  size_t bytesLeftToCopy;
  DataChunk *currentChunk;
  ByteBlock *finalByteCodeBlock;
  uint cbFinalData;
  ByteBlock **finalBlock_local;
  Recycler *alloc_local;
  Data *this_local;
  
  if (finalBlock == (ByteBlock **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0xcfa,"(finalBlock != nullptr)","Must have valid storage");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  uVar3 = GetCurrentOffset(this);
  if (uVar3 == 0) {
    *finalBlock = (ByteBlock *)0x0;
  }
  else {
    this_00 = ByteBlock::New(alloc,(byte *)0x0,uVar3);
    bytesLeftToCopy = (size_t)this->head;
    currentDest = (byte *)(ulong)uVar3;
    local_48 = ByteBlock::GetBuffer(this_00);
    while (uVar3 = DataChunk::GetSize((DataChunk *)bytesLeftToCopy),
          (byte *)(ulong)uVar3 < currentDest) {
      pbVar5 = DataChunk::GetBuffer((DataChunk *)bytesLeftToCopy);
      uVar3 = DataChunk::GetSize((DataChunk *)bytesLeftToCopy);
      js_memcpy_s(local_48,(size_t)currentDest,pbVar5,(ulong)uVar3);
      uVar3 = DataChunk::GetSize((DataChunk *)bytesLeftToCopy);
      currentDest = currentDest + -(ulong)uVar3;
      uVar3 = DataChunk::GetSize((DataChunk *)bytesLeftToCopy);
      local_48 = local_48 + uVar3;
      bytesLeftToCopy = *(size_t *)(bytesLeftToCopy + 0x18);
      if (bytesLeftToCopy == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0xd15,"(currentChunk)","We are copying more data than we have!"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
    }
    pbVar5 = DataChunk::GetBuffer((DataChunk *)bytesLeftToCopy);
    js_memcpy_s(local_48,(size_t)currentDest,pbVar5,(size_t)currentDest);
    *finalBlock = this_00;
  }
  return;
}

Assistant:

void ByteCodeWriter::Data::Copy(Recycler* alloc, ByteBlock ** finalBlock)
    {
        AssertMsg(finalBlock != nullptr, "Must have valid storage");

        uint cbFinalData = GetCurrentOffset();
        if (cbFinalData == 0)
        {
            *finalBlock = nullptr;
        }
        else
        {
            ByteBlock* finalByteCodeBlock = ByteBlock::New(alloc, /*initialContent*/nullptr, cbFinalData);

            DataChunk* currentChunk = head;
            size_t bytesLeftToCopy = cbFinalData;
            byte* currentDest = finalByteCodeBlock->GetBuffer();
            while (true)
            {
                if (bytesLeftToCopy <= currentChunk->GetSize())
                {
                    js_memcpy_s(currentDest, bytesLeftToCopy, currentChunk->GetBuffer(), bytesLeftToCopy);
                    break;
                }

                js_memcpy_s(currentDest, bytesLeftToCopy, currentChunk->GetBuffer(), currentChunk->GetSize());
                bytesLeftToCopy -= currentChunk->GetSize();
                currentDest += currentChunk->GetSize();

                currentChunk = currentChunk->nextChunk;
                AssertMsg(currentChunk, "We are copying more data than we have!");
            }

            *finalBlock = finalByteCodeBlock;
        }
    }